

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::RsRuleSyntax::setChild(RsRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  SyntaxList<slang::syntax::RsProdSyntax> *pSVar3;
  RsWeightClauseSyntax *pRVar4;
  RandJoinClauseSyntax *pRVar5;
  logic_error *this_00;
  long *plVar6;
  char *func;
  size_type *psVar7;
  long *plVar8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 2) {
    ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar2 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pRVar4 = (RsWeightClauseSyntax *)0x0;
    }
    else {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pRVar4 = (RsWeightClauseSyntax *)*ppSVar2;
      if ((pRVar4->super_SyntaxNode).kind != RsWeightClause) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::RsWeightClauseSyntax]";
LAB_002ed45f:
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,func);
      }
    }
    this->weightClause = pRVar4;
  }
  else if (index == 1) {
    ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar3 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>>(*ppSVar2);
    (this->prods).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->prods).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->prods).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount;
    sVar1 = (pSVar3->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>).size_;
    (this->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar3->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>).data_;
    (this->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar6 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar7) {
        local_b0.field_2._M_allocated_capacity = *psVar7;
        local_b0.field_2._8_8_ = plVar6[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar7;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x2cac);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar6;
      plVar8 = plVar6 + 2;
      if (local_90 == plVar8) {
        local_80 = *plVar8;
        lStack_78 = plVar6[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar8;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f0 = (long *)*plVar6;
      plVar8 = plVar6 + 2;
      if (local_f0 == plVar8) {
        local_e0 = *plVar8;
        lStack_d8 = plVar6[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar8;
      }
      local_e8 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar2 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pRVar5 = (RandJoinClauseSyntax *)0x0;
    }
    else {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pRVar5 = (RandJoinClauseSyntax *)*ppSVar2;
      if ((pRVar5->super_SyntaxNode).kind != RandJoinClause) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::RandJoinClauseSyntax]";
        goto LAB_002ed45f;
      }
    }
    this->randJoin = pRVar5;
  }
  return;
}

Assistant:

void RsRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: randJoin = child.node() ? &child.node()->as<RandJoinClauseSyntax>() : nullptr; return;
        case 1: prods = child.node()->as<SyntaxList<RsProdSyntax>>(); return;
        case 2: weightClause = child.node() ? &child.node()->as<RsWeightClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}